

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O0

vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> * __thiscall
LagrangePolynomial::get_lagrange_polynomial
          (vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>
           *__return_storage_ptr__,LagrangePolynomial *this,
          vector<int,_std::allocator<int>_> *data_points,
          vector<poly,_std::allocator<poly>_> *basis_polynomial)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> local_80;
  undefined1 local_58 [8];
  element temp;
  int i;
  vector<poly,_std::allocator<poly>_> *basis_polynomial_local;
  vector<int,_std::allocator<int>_> *data_points_local;
  LagrangePolynomial *this_local;
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>
  *result_polynomial;
  
  temp.denominator._7_1_ = 0;
  std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::vector
            (__return_storage_ptr__);
  for (temp.denominator._0_4_ = 0; uVar1 = (ulong)(int)temp.denominator,
      sVar2 = std::vector<int,_std::allocator<int>_>::size(data_points), uVar1 < sVar2;
      temp.denominator._0_4_ = (int)temp.denominator + 1) {
    element::element((element *)local_58);
    pvVar3 = std::vector<poly,_std::allocator<poly>_>::operator[]
                       (basis_polynomial,(long)(int)temp.denominator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&temp,&pvVar3->numerators);
    pvVar3 = std::vector<poly,_std::allocator<poly>_>::operator[]
                       (basis_polynomial,(long)(int)temp.denominator);
    std::vector<int,_std::allocator<int>_>::vector(&local_80,&pvVar3->denominators);
    temp.p.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)find_product(this,&local_80);
    std::vector<int,_std::allocator<int>_>::~vector(&local_80);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (data_points,(long)(int)temp.denominator);
    local_58 = (undefined1  [8])(long)*pvVar4;
    std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::
    push_back(__return_storage_ptr__,(value_type *)local_58);
    element::~element((element *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LagrangePolynomial::element> LagrangePolynomial::get_lagrange_polynomial(vector<int> data_points, vector<poly> basis_polynomial) {
    vector<element> result_polynomial;

    for(int i=0; i<data_points.size(); i++){
        element temp;
        
        temp.p = basis_polynomial[i].numerators;
        temp.denominator = find_product(basis_polynomial[i].denominators);
        temp.multiple = data_points[i];

        result_polynomial.push_back(temp);
    }

    return result_polynomial;
}